

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_core_module.c
# Opt level: O1

char * ngx_stream_core_init_main_conf(ngx_conf_t *cf,void *conf)

{
  if (*(long *)((long)conf + 0xc0) == -1) {
    *(undefined8 *)((long)conf + 0xc0) = 0x400;
  }
  if (*(long *)((long)conf + 200) == -1) {
    *(undefined8 *)((long)conf + 200) = 0x40;
  }
  *(ngx_uint_t *)((long)conf + 200) =
       -ngx_cacheline_size & (*(long *)((long)conf + 200) + ngx_cacheline_size) - 1;
  if (*(long *)((long)conf + 0xb8) != 0) {
    *(long *)((long)conf + 0xb8) = *(long *)((long)conf + 0xb8) * 3 + 3;
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_stream_core_init_main_conf(ngx_conf_t *cf, void *conf)
{
    ngx_stream_core_main_conf_t *cmcf = conf;

    ngx_conf_init_uint_value(cmcf->variables_hash_max_size, 1024);
    ngx_conf_init_uint_value(cmcf->variables_hash_bucket_size, 64);

    cmcf->variables_hash_bucket_size =
               ngx_align(cmcf->variables_hash_bucket_size, ngx_cacheline_size);

    if (cmcf->ncaptures) {
        cmcf->ncaptures = (cmcf->ncaptures + 1) * 3;
    }

    return NGX_CONF_OK;
}